

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

void __thiscall vera::Shader::setUniform(Shader *this,string *_name,int *_array,size_t _size)

{
  bool bVar1;
  GLint GVar2;
  ostream *poVar3;
  
  GVar2 = getUniformLocation(this,_name);
  bVar1 = inUse(this);
  if (!bVar1) {
    return;
  }
  switch(_size) {
  case 1:
    glUniform1i(GVar2,*_array);
    return;
  case 2:
    glUniform2i(GVar2,*_array,_array[1]);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)_name);
    poVar3 = std::operator<<(poVar3,',');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*_array);
    poVar3 = std::operator<<(poVar3,',');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,_array[1]);
    break;
  case 3:
    glUniform3i(GVar2,*_array,_array[1],_array[2]);
    return;
  case 4:
    glUniform4i(GVar2,*_array,_array[1],_array[2],_array[3]);
    return;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Passing matrix uniform as array, not supported yet");
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void Shader::setUniform(const std::string& _name, const int *_array, size_t _size) {
    GLint loc = getUniformLocation(_name);
    if (inUse()) {
        if (_size == 1) {
            glUniform1i(loc, _array[0]);
        }
        else if (_size == 2) {
            glUniform2i(loc, _array[0], _array[1]);
            std::cout << _name << ',' << _array[0] << ',' << _array[1] << std::endl;
        }
        else if (_size == 3) {
            glUniform3i(loc, _array[0], _array[1], _array[2]);
        }
        else if (_size == 4) {
            glUniform4i(loc, _array[0], _array[1], _array[2], _array[3]);
        }
        else {
            std::cerr << "Passing matrix uniform as array, not supported yet" << std::endl;
        }
    }
}